

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

int Abc_TtCofactorPerm(word *pTruth,int i,int nWords,int fSwapOnly,char *pCanonPerm,
                      uint *puCanonPhase,int fNaive)

{
  int iVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  
  bVar6 = (byte)i;
  if (fSwapOnly == 0) {
    uVar10 = (ulong)(uint)nWords;
    if (0 < nWords) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)Abc_TtCofactorPerm::pCopy1 + lVar7) =
             *(undefined8 *)((long)pTruth + lVar7);
        lVar7 = lVar7 + 8;
      } while (uVar10 * 8 - lVar7 != 0);
    }
    uVar5 = Abc_TtCofactorPermConfig(pTruth,i,nWords,0,fNaive);
    uVar8 = uVar10;
    if (uVar5 == 0) {
      return 0;
    }
    do {
      if ((int)uVar8 < 1) goto LAB_005044ed;
      lVar3 = uVar8 + 0x3ff;
      lVar7 = uVar8 - 1;
      uVar8 = uVar8 - 1;
    } while (pTruth[lVar7] == Abc_TtCofactorPermNaive::pBest[lVar3]);
    if (Abc_TtCofactorPermNaive::pBest[lVar3] <= pTruth[lVar7]) {
      if (nWords < 1) {
        return 0;
      }
      lVar7 = 0;
      do {
        *(undefined8 *)((long)pTruth + lVar7) =
             *(undefined8 *)((long)Abc_TtCofactorPerm::pCopy1 + lVar7);
        lVar7 = lVar7 + 8;
      } while (uVar10 << 3 != lVar7);
      return 0;
    }
LAB_005044ed:
    if ((uVar5 & 1) != 0) {
      *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 & 0x1f);
    }
    if ((uVar5 & 2) != 0) {
      *puCanonPhase = *puCanonPhase ^ 1 << (bVar6 + 1 & 0x1f);
    }
    uVar9 = uVar5;
    uVar4 = uVar5 & 4;
  }
  else {
    uVar9 = 0;
    uVar5 = Abc_TtCofactorPermConfig(pTruth,i,nWords,1,0);
    uVar4 = uVar5;
  }
  if (uVar4 != 0) {
    uVar9 = *puCanonPhase;
    iVar1 = i + 1;
    if (((uVar9 >> ((byte)iVar1 & 0x1f) ^ uVar9 >> (bVar6 & 0x1f)) & 1) != 0) {
      *puCanonPhase = 3 << (bVar6 & 0x1f) ^ uVar9;
    }
    cVar2 = pCanonPerm[i];
    pCanonPerm[i] = pCanonPerm[iVar1];
    pCanonPerm[iVar1] = cVar2;
    uVar9 = uVar5;
  }
  return uVar9;
}

Assistant:

int Abc_TtCofactorPerm( word * pTruth, int i, int nWords, int fSwapOnly, char * pCanonPerm, unsigned * puCanonPhase, int fNaive )
{
    if ( fSwapOnly )
    {
        int Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 1, 0 );
        if ( Config )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
    {
        static word pCopy1[1024];
        int Config;
        Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
        Config = Abc_TtCofactorPermConfig( pTruth, i, nWords, 0, fNaive );
        if ( Config == 0 )
            return 0;
        if ( Abc_TtCompareRev(pTruth, pCopy1, nWords) == 1 ) // made it worse
        {
            Abc_TtCopy( pTruth, pCopy1, nWords, 0 );
            return 0;
        }
        // improved
        if ( Config & 1 )
            *puCanonPhase ^= (1 << i);
        if ( Config & 2 )
            *puCanonPhase ^= (1 << (i+1));
        if ( Config & 4 )
        {
            if ( ((*puCanonPhase >> i) & 1) != ((*puCanonPhase >> (i+1)) & 1) )
            {
                *puCanonPhase ^= (1 << i);
                *puCanonPhase ^= (1 << (i+1));
            }
            ABC_SWAP( int, pCanonPerm[i], pCanonPerm[i+1] );
        }
        return Config;
    }
}